

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

Record * env_match(char *identifer,Environment *env)

{
  int iVar1;
  Record *local_28;
  Record *bak;
  Environment *env_local;
  char *identifer_local;
  
  if (env == (Environment *)0x0) {
    identifer_local = (char *)0x0;
  }
  else {
    for (local_28 = env->front; local_28 != (Record *)0x0; local_28 = local_28->next) {
      iVar1 = strcmp(local_28->name,identifer);
      if (iVar1 == 0) {
        return local_28;
      }
    }
    identifer_local = (char *)env_match(identifer,env->parent);
  }
  return (Record *)identifer_local;
}

Assistant:

static Record* env_match(char* identifer, Environment *env){
    if(env == NULL)
        return NULL;
    Record *bak = env->front;
    while(bak != NULL){
        if(strcmp(bak->name, identifer) == 0)
            return bak;
        bak = bak->next;
    }
    return env_match(identifer, env->parent);
}